

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O0

vector<chromosome_inf,_std::allocator<chromosome_inf>_> *
get_reference_inf(vector<chromosome_inf,_std::allocator<chromosome_inf>_> *__return_storage_ptr__,
                 string *reference)

{
  byte bVar1;
  size_t sVar2;
  reference pvVar3;
  char *pcVar4;
  string local_730 [39];
  allocator<char> local_709;
  value_type local_708;
  char *local_6e8;
  char *temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  undefined1 local_6c0 [8];
  chromosome_inf tmpinf;
  allocator<char> local_671;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  char local_630 [8];
  ifstream ref_index_handle;
  char local_428 [8];
  char buffer [1024];
  string *reference_local;
  vector<chromosome_inf,_std::allocator<chromosome_inf>_> *ref_inf;
  
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::vector(__return_storage_ptr__);
  memset(local_428,0,0x400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,".fai",&local_671);
  std::operator+(&local_650,reference,&local_670);
  std::ifstream::ifstream(local_630,(string *)&local_650,_S_in);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      chromosome_inf::chromosome_inf((chromosome_inf *)local_6c0);
      std::istream::getline(local_630,(long)local_428);
      sVar2 = strlen(local_428);
      if (sVar2 == 0) {
        res.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&temp);
        local_6e8 = strtok(local_428,"\t");
        while (pcVar4 = local_6e8, local_6e8 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,pcVar4,&local_709)
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&temp,&local_708);
          std::__cxx11::string::~string((string *)&local_708);
          std::allocator<char>::~allocator(&local_709);
          local_6e8 = strtok((char *)0x0,"\t");
        }
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&temp,0);
        std::__cxx11::string::string(local_730,(string *)pvVar3);
        std::__cxx11::string::operator=((string *)local_6c0,local_730);
        std::__cxx11::string::~string(local_730);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&temp,1);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        tmpinf.chromosome.field_2._8_8_ = strtoull(pcVar4,(char **)0x0,10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&temp,2);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        tmpinf.len = strtoull(pcVar4,(char **)0x0,10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&temp,3);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        tmpinf.start_offset._0_4_ = atoi(pcVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&temp,4);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        tmpinf.start_offset._4_4_ = atoi(pcVar4);
        std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_6c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&temp);
        res.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      chromosome_inf::~chromosome_inf((chromosome_inf *)local_6c0);
    }
  }
  std::ifstream::close();
  res.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::ifstream::~ifstream(local_630);
  return __return_storage_ptr__;
}

Assistant:

vector<chromosome_inf> get_reference_inf(string reference){
    //2021-6-16 13:02:45
    vector<struct chromosome_inf> ref_inf;
    char buffer[1024]{0};
    // cout << reference+ string(".fai")<<endl;

    ifstream ref_index_handle (reference + string(".fai")); 
    if (ref_index_handle.is_open()){
        while (! ref_index_handle.eof() )
        {
            struct chromosome_inf tmpinf;

            ref_index_handle.getline (buffer,1024);  //读入每行
            if ( strlen(buffer) == 0 ){
                continue;
            }
            
            // C type string split 
            vector<string> res;
            char* temp = strtok(buffer, "\t");
            while(temp != NULL)
            {
                res.push_back(string(temp));
                temp = strtok(NULL, "\t");
            }

            tmpinf.chromosome = string(res[0]);
            tmpinf.len = strtoull( res[1].c_str(), NULL,10 );
            tmpinf.start_offset = strtoull( res[2].c_str(), NULL,10 );
            tmpinf.line_bases = atoi( res[3].c_str() );
            tmpinf.line_width = atoi( res[4].c_str() );

            ref_inf.push_back(tmpinf);

            // cout<< tmpinf.chromosome <<endl;
            // cout<< tmpinf.len <<endl;
            // cout<< tmpinf.start_offset <<endl;
            // cout<< tmpinf.line_bases <<endl;
            // cout<< tmpinf.line_width <<endl;
            
        }
    }
    
    ref_index_handle.close();


    return ref_inf;
}